

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O2

void duckdb::ColumnDataCopy<int>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ColumnDataCollectionSegment *this;
  ColumnDataAppendState *state;
  sel_t *psVar1;
  SelectionVector *pSVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  reference pvVar5;
  ColumnDataAllocator *this_00;
  data_ptr_t pdVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  VectorDataIndex prev_index;
  ulong uVar10;
  ValidityMask result_validity;
  idx_t local_a0;
  TemplatedValidityMask<unsigned_long> local_50;
  
  this = meta_data->segment;
  state = meta_data->state;
  prev_index.index = (meta_data->vector_data_index).index;
  local_a0 = offset;
  while (copy_count != 0) {
    pvVar5 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
    uVar10 = (ulong)(0x800 - pvVar5->count);
    if (copy_count <= uVar10) {
      uVar10 = copy_count;
    }
    this_00 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
    pdVar6 = ColumnDataAllocator::GetDataPointer
                       (this_00,&state->current_chunk_state,pvVar5->block_id,pvVar5->offset);
    local_50.validity_mask = (unsigned_long *)(pdVar6 + 0x2000);
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_50.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.capacity = 0x800;
    if (pvVar5->count == 0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid(&local_50,0x800);
    }
    if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pSVar2 = source_data->sel;
      pdVar3 = source_data->data;
      pdVar6 = pdVar6 + (ulong)pvVar5->count * 4;
      uVar9 = uVar10;
      iVar7 = local_a0;
      while (bVar4 = uVar9 != 0, uVar9 = uVar9 - 1, bVar4) {
        psVar1 = pSVar2->sel_vector;
        iVar8 = iVar7;
        if (psVar1 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar1[iVar7];
        }
        *(undefined4 *)pdVar6 = *(undefined4 *)(pdVar3 + iVar8 * 4);
        pdVar6 = pdVar6 + 4;
        iVar7 = iVar7 + 1;
      }
    }
    else {
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        psVar1 = source_data->sel->sel_vector;
        if (psVar1 == (sel_t *)0x0) {
          iVar7 = local_a0 + uVar9;
        }
        else {
          iVar7 = (idx_t)psVar1[local_a0 + uVar9];
        }
        bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(source_data->validity).super_TemplatedValidityMask<unsigned_long>,iVar7
                          );
        if (bVar4) {
          *(undefined4 *)(pdVar6 + uVar9 * 4 + (ulong)pvVar5->count * 4) =
               *(undefined4 *)(source_data->data + iVar7 * 4);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(&local_50,pvVar5->count + uVar9);
        }
      }
    }
    pvVar5->count = pvVar5->count + (short)uVar10;
    copy_count = copy_count - uVar10;
    if (copy_count != 0) {
      if ((pvVar5->next_data).index == 0xffffffffffffffff) {
        ColumnDataCollectionSegment::AllocateVector
                  (this,&source->type,meta_data->chunk_data,&state->current_chunk_state,prev_index);
      }
      pvVar5 = vector<duckdb::VectorMetaData,_true>::get<true>(&this->vector_data,prev_index.index);
      prev_index.index = (pvVar5->next_data).index;
    }
    local_a0 = local_a0 + uVar10;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void ColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                           idx_t offset, idx_t copy_count) {
	TemplatedColumnDataCopy<StandardValueCopy<T>>(meta_data, source_data, source, offset, copy_count);
}